

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double * fisher_sample(double kappa,double *mu,int n,int *seed)

{
  undefined1 auVar1 [16];
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double *xyz;
  double *theta;
  double rst [3];
  double r8_pi;
  double *phi;
  double mu_norm;
  double lambda;
  int local_90;
  int k;
  int j;
  int i;
  double beta;
  double alpha;
  double a [9];
  int *seed_local;
  int n_local;
  double *mu_local;
  double kappa_local;
  
  dVar6 = r8vec_length(3,mu);
  if ((dVar6 == 0.0) && (!NAN(dVar6))) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"FISHER_SAMPLE - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  MU = 0.\n");
    exit(1);
  }
  dVar6 = acos(mu[2] / dVar6);
  dVar6 = -dVar6;
  dVar7 = atan2(mu[1],*mu);
  dVar8 = exp(kappa * -2.0);
  pdVar2 = r8vec_uniform_01_new(n,seed);
  for (lambda._4_4_ = 0; lambda._4_4_ < n; lambda._4_4_ = lambda._4_4_ + 1) {
    if ((kappa != 0.0) || (NAN(kappa))) {
      dVar9 = log(pdVar2[lambda._4_4_] * (1.0 - dVar8) + dVar8);
      dVar9 = sqrt(-dVar9 / (kappa * 2.0));
      dVar9 = asin(dVar9);
      pdVar2[lambda._4_4_] = dVar9 * 2.0;
    }
    else {
      dVar9 = sqrt(1.0 - pdVar2[lambda._4_4_]);
      dVar9 = asin(dVar9);
      pdVar2[lambda._4_4_] = dVar9 * 2.0;
    }
  }
  pdVar3 = r8vec_uniform_01_new(n,seed);
  for (lambda._4_4_ = 0; lambda._4_4_ < n; lambda._4_4_ = lambda._4_4_ + 1) {
    pdVar3[lambda._4_4_] = pdVar3[lambda._4_4_] * 6.283185307179586;
  }
  cos(dVar6);
  cos(dVar7);
  dVar8 = sin(dVar7);
  a[0] = -dVar8;
  dVar8 = sin(dVar6);
  dVar9 = cos(dVar7);
  a[1] = dVar8 * dVar9;
  dVar8 = cos(dVar6);
  dVar9 = sin(dVar7);
  a[2] = dVar8 * dVar9;
  a[3] = cos(dVar7);
  dVar8 = sin(dVar6);
  dVar7 = sin(dVar7);
  a[4] = dVar8 * dVar7;
  dVar7 = sin(dVar6);
  a[5] = -dVar7;
  a[6] = 0.0;
  a[7] = cos(dVar6);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(n * 3);
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pdVar5 = (double *)operator_new__(uVar4);
  for (lambda._4_4_ = 0; lambda._4_4_ < n; lambda._4_4_ = lambda._4_4_ + 1) {
    sin(pdVar2[lambda._4_4_]);
    cos(pdVar3[lambda._4_4_]);
    dVar6 = sin(pdVar2[lambda._4_4_]);
    dVar7 = sin(pdVar3[lambda._4_4_]);
    rst[0] = dVar6 * dVar7;
    rst[1] = cos(pdVar2[lambda._4_4_]);
    for (k = 0; k < 3; k = k + 1) {
      pdVar5[k + lambda._4_4_ * 3] = 0.0;
      for (local_90 = 0; local_90 < 3; local_90 = local_90 + 1) {
        pdVar5[k + lambda._4_4_ * 3] =
             a[(long)(k + local_90 * 3) + -1] * rst[(long)local_90 + -1] +
             pdVar5[k + lambda._4_4_ * 3];
      }
    }
  }
  if (pdVar2 != (double *)0x0) {
    operator_delete__(pdVar2);
  }
  if (pdVar3 != (double *)0x0) {
    operator_delete__(pdVar3);
  }
  return pdVar5;
}

Assistant:

double *fisher_sample ( double kappa, double mu[], int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    FISHER_SAMPLE samples the Fisher distribution.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    06 March 2007
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Nicholas Fisher, Toby Lewis, Brian Embleton,
//    Statistical Analysis of Spherical Data,
//    Cambridge, 2003,
//    ISBN13: 978-0521456999,
//    LC: QA276.F489.
//
//  Parameters:
//
//    Input, double KAPPA, the concentration parameter.
//
//    Input, double MU[3], the mean direction.
//    MU should have unit Euclidean norm, but this routine will
//    automatically work with a normalized version of MU.
//
//    Input, int N, the number of samples to choose.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double FISHER_SAMPLE[3*N], a sample of the Fisher distribution.
//
//  Local Parameters:
//
//    Local, double ALPHA, BETA, the colatitude (theta) and
//    longitude (phi) of the mean direction.
//
{
  double a[3*3];
  double alpha;
  double beta;
  int i;
  int j;
  int k;
  double lambda;
  double mu_norm;
  double *phi;
  const double r8_pi = 3.141592653589793;
  double rst[3];
  double *theta;
  double *xyz;

  mu_norm = r8vec_length ( 3, mu );

  if ( mu_norm == 0.0 )
  {
    cerr << "\n";
    cerr << "FISHER_SAMPLE - Fatal error!\n";
    cerr << "  MU = 0.\n";
    exit ( 1 );
  }

  alpha = - acos ( mu[2] / mu_norm );
  beta = atan2 ( mu[1], mu[0] );

  lambda = exp ( - 2.0 * kappa );

  theta = r8vec_uniform_01_new ( n, seed );

  for ( k = 0; k < n; k++ )
  {
    if ( kappa == 0.0 )
    {
      theta[k] = 2.0 * asin ( sqrt ( 1.0 - theta[k] ) );
    }
    else
    {
      theta[k] = 2.0 * asin ( sqrt (
        - log ( theta[k] * ( 1.0 - lambda ) + lambda )
        / ( 2.0 * kappa ) ) );
    }
  }

  phi = r8vec_uniform_01_new ( n, seed );

  for ( k = 0; k < n; k++ )
  {
    phi[k] = 2.0 * r8_pi * phi[k];
  }
//
//  Compute the rotation matrix.
//
  a[0+0*3] =   cos ( alpha ) * cos ( beta );
  a[1+0*3] =                 - sin ( beta );
  a[2+0*3] =   sin ( alpha ) * cos ( beta );

  a[0+1*3] =   cos ( alpha ) * sin ( beta );
  a[1+1*3] =                 + cos ( beta );
  a[2+1*3] =   sin ( alpha ) * sin ( beta );

  a[0+2*3] = - sin ( alpha );
  a[1+2*3] =   0.0;
  a[2+2*3] =   cos ( alpha );
//
//  Compute the unrotated points.
//
  xyz = new double[3*n];

  for ( k = 0; k < n; k++ )
  {
    rst[0] = sin ( theta[k] ) * cos ( phi[k] );
    rst[1] = sin ( theta[k] ) * sin ( phi[k] );
    rst[2] = cos ( theta[k] );
//
//  Rotate the points.
//
    for ( i = 0; i < 3; i++ )
    {
      xyz[i+k*3] = 0.0;
      for ( j = 0; j < 3; j++ )
      {
        xyz[i+k*3] = xyz[i+k*3] + a[i+j*3] * rst[j];
      }
    }
  }

  delete [] theta;
  delete [] phi;

  return xyz;
}